

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

uint16_t __thiscall TcpServerImpl::GetServerPort(TcpServerImpl *this)

{
  int iVar1;
  int iVar2;
  uint16_t unaff_BP;
  allocator<char> local_fd;
  socklen_t addLen;
  string servInfoPeer;
  string caAddrPeer;
  string local_b8;
  sockaddr_storage addrPe;
  
  addrPe.__ss_padding[0x6e] = '\0';
  addrPe.__ss_padding[0x6f] = '\0';
  addrPe.__ss_padding[0x70] = '\0';
  addrPe.__ss_padding[0x71] = '\0';
  addrPe.__ss_padding[0x72] = '\0';
  addrPe.__ss_padding[0x73] = '\0';
  addrPe.__ss_padding[0x74] = '\0';
  addrPe.__ss_padding[0x75] = '\0';
  addrPe.__ss_align = 0;
  addrPe.__ss_padding[0x5e] = '\0';
  addrPe.__ss_padding[0x5f] = '\0';
  addrPe.__ss_padding[0x60] = '\0';
  addrPe.__ss_padding[0x61] = '\0';
  addrPe.__ss_padding[0x62] = '\0';
  addrPe.__ss_padding[99] = '\0';
  addrPe.__ss_padding[100] = '\0';
  addrPe.__ss_padding[0x65] = '\0';
  addrPe.__ss_padding[0x66] = '\0';
  addrPe.__ss_padding[0x67] = '\0';
  addrPe.__ss_padding[0x68] = '\0';
  addrPe.__ss_padding[0x69] = '\0';
  addrPe.__ss_padding[0x6a] = '\0';
  addrPe.__ss_padding[0x6b] = '\0';
  addrPe.__ss_padding[0x6c] = '\0';
  addrPe.__ss_padding[0x6d] = '\0';
  addrPe.__ss_padding[0x4e] = '\0';
  addrPe.__ss_padding[0x4f] = '\0';
  addrPe.__ss_padding[0x50] = '\0';
  addrPe.__ss_padding[0x51] = '\0';
  addrPe.__ss_padding[0x52] = '\0';
  addrPe.__ss_padding[0x53] = '\0';
  addrPe.__ss_padding[0x54] = '\0';
  addrPe.__ss_padding[0x55] = '\0';
  addrPe.__ss_padding[0x56] = '\0';
  addrPe.__ss_padding[0x57] = '\0';
  addrPe.__ss_padding[0x58] = '\0';
  addrPe.__ss_padding[0x59] = '\0';
  addrPe.__ss_padding[0x5a] = '\0';
  addrPe.__ss_padding[0x5b] = '\0';
  addrPe.__ss_padding[0x5c] = '\0';
  addrPe.__ss_padding[0x5d] = '\0';
  addrPe.__ss_padding[0x3e] = '\0';
  addrPe.__ss_padding[0x3f] = '\0';
  addrPe.__ss_padding[0x40] = '\0';
  addrPe.__ss_padding[0x41] = '\0';
  addrPe.__ss_padding[0x42] = '\0';
  addrPe.__ss_padding[0x43] = '\0';
  addrPe.__ss_padding[0x44] = '\0';
  addrPe.__ss_padding[0x45] = '\0';
  addrPe.__ss_padding[0x46] = '\0';
  addrPe.__ss_padding[0x47] = '\0';
  addrPe.__ss_padding[0x48] = '\0';
  addrPe.__ss_padding[0x49] = '\0';
  addrPe.__ss_padding[0x4a] = '\0';
  addrPe.__ss_padding[0x4b] = '\0';
  addrPe.__ss_padding[0x4c] = '\0';
  addrPe.__ss_padding[0x4d] = '\0';
  addrPe.__ss_padding[0x2e] = '\0';
  addrPe.__ss_padding[0x2f] = '\0';
  addrPe.__ss_padding[0x30] = '\0';
  addrPe.__ss_padding[0x31] = '\0';
  addrPe.__ss_padding[0x32] = '\0';
  addrPe.__ss_padding[0x33] = '\0';
  addrPe.__ss_padding[0x34] = '\0';
  addrPe.__ss_padding[0x35] = '\0';
  addrPe.__ss_padding[0x36] = '\0';
  addrPe.__ss_padding[0x37] = '\0';
  addrPe.__ss_padding[0x38] = '\0';
  addrPe.__ss_padding[0x39] = '\0';
  addrPe.__ss_padding[0x3a] = '\0';
  addrPe.__ss_padding[0x3b] = '\0';
  addrPe.__ss_padding[0x3c] = '\0';
  addrPe.__ss_padding[0x3d] = '\0';
  addrPe.__ss_padding[0x1e] = '\0';
  addrPe.__ss_padding[0x1f] = '\0';
  addrPe.__ss_padding[0x20] = '\0';
  addrPe.__ss_padding[0x21] = '\0';
  addrPe.__ss_padding[0x22] = '\0';
  addrPe.__ss_padding[0x23] = '\0';
  addrPe.__ss_padding[0x24] = '\0';
  addrPe.__ss_padding[0x25] = '\0';
  addrPe.__ss_padding[0x26] = '\0';
  addrPe.__ss_padding[0x27] = '\0';
  addrPe.__ss_padding[0x28] = '\0';
  addrPe.__ss_padding[0x29] = '\0';
  addrPe.__ss_padding[0x2a] = '\0';
  addrPe.__ss_padding[0x2b] = '\0';
  addrPe.__ss_padding[0x2c] = '\0';
  addrPe.__ss_padding[0x2d] = '\0';
  addrPe.__ss_padding[0xe] = '\0';
  addrPe.__ss_padding[0xf] = '\0';
  addrPe.__ss_padding[0x10] = '\0';
  addrPe.__ss_padding[0x11] = '\0';
  addrPe.__ss_padding[0x12] = '\0';
  addrPe.__ss_padding[0x13] = '\0';
  addrPe.__ss_padding[0x14] = '\0';
  addrPe.__ss_padding[0x15] = '\0';
  addrPe.__ss_padding[0x16] = '\0';
  addrPe.__ss_padding[0x17] = '\0';
  addrPe.__ss_padding[0x18] = '\0';
  addrPe.__ss_padding[0x19] = '\0';
  addrPe.__ss_padding[0x1a] = '\0';
  addrPe.__ss_padding[0x1b] = '\0';
  addrPe.__ss_padding[0x1c] = '\0';
  addrPe.__ss_padding[0x1d] = '\0';
  addrPe.ss_family = 0;
  addrPe.__ss_padding[0] = '\0';
  addrPe.__ss_padding[1] = '\0';
  addrPe.__ss_padding[2] = '\0';
  addrPe.__ss_padding[3] = '\0';
  addrPe.__ss_padding[4] = '\0';
  addrPe.__ss_padding[5] = '\0';
  addrPe.__ss_padding[6] = '\0';
  addrPe.__ss_padding[7] = '\0';
  addrPe.__ss_padding[8] = '\0';
  addrPe.__ss_padding[9] = '\0';
  addrPe.__ss_padding[10] = '\0';
  addrPe.__ss_padding[0xb] = '\0';
  addrPe.__ss_padding[0xc] = '\0';
  addrPe.__ss_padding[0xd] = '\0';
  addLen = 0x80;
  iVar1 = getsockname(*(this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,(sockaddr *)&addrPe,&addLen);
  if (iVar1 == 0) {
    caAddrPeer._M_dataplus._M_p = (pointer)&caAddrPeer.field_2;
    std::__cxx11::string::_M_construct((ulong)&caAddrPeer,'/');
    servInfoPeer._M_dataplus._M_p = (pointer)&servInfoPeer.field_2;
    std::__cxx11::string::_M_construct((ulong)&servInfoPeer,' ');
    iVar1 = getnameinfo((sockaddr *)&addrPe,0x80,caAddrPeer._M_dataplus._M_p,0x2e,
                        servInfoPeer._M_dataplus._M_p,0x20,3);
    if (iVar1 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,servInfoPeer._M_dataplus._M_p,&local_fd);
      iVar2 = std::__cxx11::stoi(&local_b8,(size_t *)0x0,10);
      unaff_BP = (uint16_t)iVar2;
      std::__cxx11::string::~string((string *)&local_b8);
    }
    std::__cxx11::string::~string((string *)&servInfoPeer);
    std::__cxx11::string::~string((string *)&caAddrPeer);
    if (iVar1 == 0) {
      return unaff_BP;
    }
  }
  return 0;
}

Assistant:

uint16_t TcpServerImpl::GetServerPort()
{
    struct sockaddr_storage addrPe{};
    socklen_t addLen = sizeof(addrPe);
    if (::getsockname(m_vSock[0], reinterpret_cast<struct sockaddr*>(&addrPe), &addLen) == 0)  // Get our IP where the connection was established
    {
        string caAddrPeer(INET6_ADDRSTRLEN + 1, 0);
        string servInfoPeer(NI_MAXSERV, 0);
        if (::getnameinfo(reinterpret_cast<struct sockaddr*>(&addrPe), sizeof(struct sockaddr_storage), &caAddrPeer[0], INET6_ADDRSTRLEN, &servInfoPeer[0], NI_MAXSERV, NI_NUMERICHOST | NI_NUMERICSERV) == 0)
        {
            return static_cast<uint16_t>(stoi(&servInfoPeer[0]));
        }
    }

    return 0;
}